

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_load_submodules(lysp_ctx *pctx,lysp_module *pmod,ly_set *new_mods)

{
  LY_ERR LVar1;
  undefined8 local_108;
  char *local_f0;
  char *local_d8;
  char *local_d0;
  ly_ctx *local_b0;
  ly_ctx *local_a0;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_in *in;
  lysp_load_module_check_data check_data;
  _func_void_void_ptr_void_ptr *submodule_data_free;
  char *pcStack_58;
  LYS_INFORMAT format;
  char *submodule_data;
  lysp_include *inc;
  lysp_submodule *submod;
  LY_ERR r;
  LY_ERR ret;
  ly_ctx *ctx;
  uint64_t u;
  ly_set *new_mods_local;
  lysp_module *pmod_local;
  lysp_ctx *pctx_local;
  
  if (pctx == (lysp_ctx *)0x0) {
    local_a0 = (ly_ctx *)0x0;
  }
  else {
    local_a0 = (ly_ctx *)
               **(long **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  _r = local_a0;
  ctx = (ly_ctx *)0x0;
  u = (uint64_t)new_mods;
  new_mods_local = (ly_set *)pmod;
  pmod_local = (lysp_module *)pctx;
  do {
    if (new_mods_local[1].field_2.dnodes == (lyd_node **)0x0) {
      local_b0 = (ly_ctx *)0x0;
    }
    else {
      local_b0 = (ly_ctx *)new_mods_local[1].field_2.dnodes[-1];
    }
    if (local_b0 <= ctx) {
      return LY_SUCCESS;
    }
    submod._4_4_ = 0;
    inc = (lysp_include *)0x0;
    submodule_data = (char *)(new_mods_local[1].field_2.dnodes + (long)ctx * 7);
    if (((lysp_include *)submodule_data)->submodule == (lysp_submodule *)0x0) {
      if ((*(byte *)((long)&new_mods_local[7].field_2 + 1) >> 1 & 1) != 0) {
        LVar1 = lysp_main_pmod_get_submodule((lysp_ctx *)pmod_local,(lysp_include *)submodule_data);
        if (LVar1 != LY_ENOT) {
          return LVar1;
        }
        submod._4_4_ = 0xb;
      }
      LVar1 = lysp_parsed_mods_get_submodule((lysp_ctx *)pmod_local,(lysp_include *)submodule_data);
      if (LVar1 != LY_ENOT) {
        return LVar1;
      }
      submod._0_4_ = 0xb;
      if ((_r->flags & 0x20) != 0) goto LAB_0019ffe8;
      while( true ) {
        if (_r->imp_clb != (ly_module_imp_clb)0x0) {
          pcStack_58 = (char *)0x0;
          submodule_data_free._4_4_ = LYS_IN_UNKNOWN;
          check_data.submoduleof = (char *)0x0;
          memset(&in,0,0x20);
          if (submodule_data[0x28] == '\0') {
            local_d0 = (char *)0x0;
          }
          else {
            local_d0 = submodule_data + 0x28;
          }
          LVar1 = (*_r->imp_clb)(*(char **)(**(long **)(pmod_local->typedefs->units +
                                                       (ulong)(*(int *)((long)&pmod_local->typedefs
                                                                               ->name + 4) - 1) * 8)
                                           + 8),(char *)0x0,*(char **)(submodule_data + 8),local_d0,
                                 _r->imp_clb_data,(LYS_INFORMAT *)((long)&submodule_data_free + 4),
                                 &stack0xffffffffffffffa8,
                                 (ly_module_imp_data_free_clb *)&check_data.submoduleof);
          if (LVar1 == LY_SUCCESS) {
            LVar1 = ly_in_new_memory(pcStack_58,(ly_in **)&ret___1);
            if (LVar1 != LY_SUCCESS) {
              return LVar1;
            }
            in = *(ly_in **)(submodule_data + 8);
            if (submodule_data[0x28] == '\0') {
              local_d8 = (char *)0x0;
            }
            else {
              local_d8 = submodule_data + 0x28;
            }
            check_data.name = local_d8;
            check_data.path =
                 *(char **)(**(long **)(pmod_local->typedefs->units +
                                       (ulong)(*(int *)((long)&pmod_local->typedefs->name + 4) - 1)
                                       * 8) + 8);
            lys_parse_submodule(_r,_ret___1,submodule_data_free._4_4_,
                                (lysp_ctx *)pmod_local->groupings,lysp_load_module_check,&in,
                                (ly_set *)u,(lysp_submodule **)&inc);
            submodule_data = (char *)(new_mods_local[1].field_2.dnodes + (long)ctx * 7);
            ly_in_free(_ret___1,'\0');
            if (check_data.submoduleof != (char *)0x0) {
              (*(code *)check_data.submoduleof)(pcStack_58);
            }
          }
        }
        if ((inc != (lysp_include *)0x0) || ((_r->flags & 0x20) != 0)) break;
LAB_0019ffe8:
        if ((_r->flags & 8) == 0) {
          if (submodule_data[0x28] == '\0') {
            local_f0 = (char *)0x0;
          }
          else {
            local_f0 = submodule_data + 0x28;
          }
          lys_parse_localfile(_r,*(char **)(submodule_data + 8),local_f0,
                              (lysp_ctx *)pmod_local->groupings,
                              *(char **)(**(long **)(((pmod_local->groupings->field_0).node.exts)->
                                                     argument +
                                                    (ulong)(*(int *)((long)&((pmod_local->groupings
                                                                             ->field_0).node.exts)->
                                                                            name + 4) - 1) * 8) + 8)
                              ,'\x01',(ly_set *)u,&inc);
          submodule_data = (char *)(new_mods_local[1].field_2.dnodes + (long)ctx * 7);
        }
        if ((inc != (lysp_include *)0x0) || ((_r->flags & 0x20) == 0)) break;
      }
      if (inc != (lysp_include *)0x0) {
        if ((submodule_data[0x28] == '\0') && ((*(byte *)((long)&inc[2].name + 1) >> 2 & 3) == 1)) {
          *(byte *)((long)&inc[2].name + 1) = *(byte *)((long)&inc[2].name + 1) & 0xf3 | 8;
        }
        *(lysp_include **)submodule_data = inc;
        if ((submod._4_4_ == 0xb) &&
           (LVar1 = lysp_inject_submodule
                              ((lysp_ctx *)pmod_local,
                               (lysp_include *)(new_mods_local[1].field_2.dnodes + (long)ctx * 7)),
           LVar1 != LY_SUCCESS)) {
          return LVar1;
        }
      }
      if (*(long *)submodule_data == 0) {
        if ((*(byte *)(*(long *)(pmod_local->typedefs->units +
                                (ulong)(*(int *)((long)&pmod_local->typedefs->name + 4) - 1) * 8) +
                      0x79) >> 1 & 1) == 0) {
          local_108 = *(undefined8 *)
                       (**(long **)(pmod_local->typedefs->units +
                                   (ulong)(*(int *)((long)&pmod_local->typedefs->name + 4) - 1) * 8)
                       + 8);
        }
        else {
          local_108 = *(undefined8 *)
                       (*(long *)(pmod_local->typedefs->units +
                                 (ulong)(*(int *)((long)&pmod_local->typedefs->name + 4) - 1) * 8) +
                       0x80);
        }
        ly_vlog(_r,(char *)0x0,LYVE_REFERENCE,"Including \"%s\" submodule into \"%s\" failed.",
                *(undefined8 *)(submodule_data + 8),local_108);
        return LY_EVALID;
      }
    }
    ctx = (ly_ctx *)((long)&(ctx->dict).hash_tab + 1);
  } while( true );
}

Assistant:

LY_ERR
lysp_load_submodules(struct lysp_ctx *pctx, struct lysp_module *pmod, struct ly_set *new_mods)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ctx *ctx = PARSER_CTX(pctx);

    LY_ARRAY_FOR(pmod->includes, u) {
        LY_ERR ret = LY_SUCCESS, r;
        struct lysp_submodule *submod = NULL;
        struct lysp_include *inc = &pmod->includes[u];

        if (inc->submodule) {
            continue;
        }

        if (pmod->is_submod) {
            /* try to find the submodule in the main module or its submodules */
            ret = lysp_main_pmod_get_submodule(pctx, inc);
            LY_CHECK_RET(ret != LY_ENOT, ret);
        }

        /* try to use currently parsed submodule */
        r = lysp_parsed_mods_get_submodule(pctx, inc);
        LY_CHECK_RET(r != LY_ENOT, r);

        /* submodule not present in the main module, get the input data and parse it */
        if (!(ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
search_clb:
            if (ctx->imp_clb) {
                const char *submodule_data = NULL;
                LYS_INFORMAT format = LYS_IN_UNKNOWN;

                void (*submodule_data_free)(void *module_data, void *user_data) = NULL;
                struct lysp_load_module_check_data check_data = {0};
                struct ly_in *in;

                if (ctx->imp_clb(PARSER_CUR_PMOD(pctx)->mod->name, NULL, inc->name,
                        inc->rev[0] ? inc->rev : NULL, ctx->imp_clb_data,
                        &format, &submodule_data, &submodule_data_free) == LY_SUCCESS) {
                    LY_CHECK_RET(ly_in_new_memory(submodule_data, &in));
                    check_data.name = inc->name;
                    check_data.revision = inc->rev[0] ? inc->rev : NULL;
                    check_data.submoduleof = PARSER_CUR_PMOD(pctx)->mod->name;
                    lys_parse_submodule(ctx, in, format, pctx->main_ctx, lysp_load_module_check, &check_data, new_mods,
                            &submod);

                    /* update inc pointer - parsing another (YANG 1.0) submodule can cause injecting
                     * submodule's include into main module, where it is missing */
                    inc = &pmod->includes[u];

                    ly_in_free(in, 0);
                    if (submodule_data_free) {
                        submodule_data_free((void *)submodule_data, ctx->imp_clb_data);
                    }
                }
            }
            if (!submod && !(ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
                goto search_file;
            }
        } else {
search_file:
            if (!(ctx->flags & LY_CTX_DISABLE_SEARCHDIRS)) {
                /* submodule was not received from the callback or there is no callback set */
                lys_parse_localfile(ctx, inc->name, inc->rev[0] ? inc->rev : NULL, pctx->main_ctx,
                        PARSER_CUR_PMOD(pctx->main_ctx)->mod->name, 1, new_mods, (void **)&submod);

                /* update inc pointer - parsing another (YANG 1.0) submodule can cause injecting
                 * submodule's include into main module, where it is missing */
                inc = &pmod->includes[u];
            }
            if (!submod && (ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
                goto search_clb;
            }
        }
        if (submod) {
            if (!inc->rev[0] && (submod->latest_revision == 1)) {
                /* update the latest_revision flag - here we have selected the latest available schema,
                 * consider that even the callback provides correct latest revision */
                submod->latest_revision = 2;
            }

            inc->submodule = submod;
            if (ret == LY_ENOT) {
                /* the submodule include is not present in YANG 1.0 main module - add it there */
                LY_CHECK_RET(lysp_inject_submodule(pctx, &pmod->includes[u]));
            }
        }
        if (!inc->submodule) {
            LOGVAL(ctx, LYVE_REFERENCE, "Including \"%s\" submodule into \"%s\" failed.", inc->name,
                    PARSER_CUR_PMOD(pctx)->is_submod ? ((struct lysp_submodule *)PARSER_CUR_PMOD(pctx))->name :
                    PARSER_CUR_PMOD(pctx)->mod->name);
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}